

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

AtomicNotify * __thiscall MixedArena::alloc<wasm::AtomicNotify>(MixedArena *this)

{
  AtomicNotify *pAVar1;
  
  pAVar1 = (AtomicNotify *)allocSpace(this,0x38,8);
  *(undefined8 *)&(pAVar1->super_SpecificExpression<(wasm::Expression::Id)27>).super_Expression = 0;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)27>).super_Expression.type.id = 0;
  (pAVar1->offset).addr = 0;
  pAVar1->ptr = (Expression *)0x0;
  pAVar1->notifyCount = (Expression *)0x0;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)27>).super_Expression._id = AtomicNotifyId
  ;
  (pAVar1->memory).super_IString.str._M_len = 0;
  (pAVar1->memory).super_IString.str._M_str = (char *)0x0;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)27>).super_Expression.type.id = 0;
  (pAVar1->offset).addr = 0;
  return pAVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }